

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedbook.c
# Opt level: O3

int vorbis_book_init_decode(codebook *c,static_codebook *s)

{
  char cVar1;
  long lVar2;
  size_t __size;
  static_codebook *b;
  codebook *pcVar3;
  ogg_uint32_t *poVar4;
  ogg_uint32_t *poVar5;
  float *pfVar6;
  int *piVar7;
  char *pcVar8;
  long lVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  void *__base;
  int iVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  int *sparsemap;
  uint uVar22;
  int aiStack_50 [2];
  size_t local_48;
  static_codebook *local_40;
  codebook *local_38;
  
  c->quantvals = 0;
  c->minval = 0;
  *(undefined8 *)&c->delta = 0;
  c->dec_firsttable = (ogg_uint32_t *)0x0;
  c->dec_firsttablen = 0;
  c->dec_maxlength = 0;
  c->dec_index = (int *)0x0;
  c->dec_codelengths = (char *)0x0;
  c->valuelist = (float *)0x0;
  c->codelist = (ogg_uint32_t *)0x0;
  c->used_entries = 0;
  c->c = (static_codebook *)0x0;
  c->dim = 0;
  c->entries = 0;
  lVar9 = s->entries;
  if (lVar9 < 1) {
    c->entries = lVar9;
    c->used_entries = 0;
    c->dim = s->dim;
    return 0;
  }
  lVar13 = 0;
  uVar22 = 0;
  do {
    uVar22 = uVar22 + ('\0' < s->lengthlist[lVar13]);
    lVar13 = lVar13 + 1;
  } while (lVar9 != lVar13);
  c->entries = lVar9;
  uVar17 = (ulong)uVar22;
  c->used_entries = uVar17;
  c->dim = s->dim;
  if (uVar22 != 0) {
    aiStack_50[0] = 0x1d9e54;
    aiStack_50[1] = 0;
    local_40 = s;
    local_38 = c;
    poVar4 = _make_words(s->lengthlist,lVar9,uVar17);
    pcVar3 = local_38;
    lVar9 = -(uVar17 * 8 + 0xf & 0xfffffffffffffff0);
    __base = (void *)((long)&local_48 + lVar9);
    if (poVar4 == (ogg_uint32_t *)0x0) {
      *(undefined8 *)((long)aiStack_50 + lVar9) = 0x1da075;
      vorbis_book_clear(pcVar3);
      return -1;
    }
    lVar13 = 0;
    do {
      uVar20 = *(uint *)((long)poVar4 + lVar13);
      uVar20 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 | uVar20 << 0x18;
      uVar20 = (uVar20 & 0xf0f0f0f) << 4 | uVar20 >> 4 & 0xf0f0f0f;
      uVar20 = (uVar20 >> 2 & 0x33333333) + (uVar20 & 0x33333333) * 4;
      *(uint *)((long)poVar4 + lVar13) = (uVar20 >> 1 & 0x55555555) + (uVar20 & 0x55555555) * 2;
      *(long *)((long)__base + lVar13 * 2) = (long)poVar4 + lVar13;
      lVar13 = lVar13 + 4;
    } while (uVar17 * 4 - lVar13 != 0);
    *(undefined8 *)((long)aiStack_50 + lVar9) = 0x1d9ef6;
    qsort(__base,uVar17,8,sort32a);
    sparsemap = (int *)((long)__base - (uVar17 * 4 + 0xf & 0xfffffffffffffff0));
    local_48 = uVar17 * 4;
    sparsemap[-2] = 0x1d9f1c;
    sparsemap[-1] = 0;
    poVar5 = (ogg_uint32_t *)malloc(uVar17 * 4);
    local_38->codelist = poVar5;
    uVar14 = 0;
    do {
      sparsemap[(int)((ulong)(*(long *)((long)__base + uVar14 * 8) - (long)poVar4) >> 2)] =
           (int)uVar14;
      uVar14 = uVar14 + 1;
    } while (uVar17 != uVar14);
    uVar14 = 0;
    do {
      poVar5[sparsemap[uVar14]] = poVar4[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar17 != uVar14);
    sparsemap[-2] = 0x1d9f5d;
    sparsemap[-1] = 0;
    free(poVar4);
    b = local_40;
    sparsemap[-2] = 0x1d9f6f;
    sparsemap[-1] = 0;
    pfVar6 = _book_unquantize(b,uVar22,sparsemap);
    pcVar3 = local_38;
    __size = local_48;
    local_38->valuelist = pfVar6;
    sparsemap[-2] = 0x1d9f80;
    sparsemap[-1] = 0;
    piVar7 = (int *)malloc(__size);
    pcVar3->dec_index = piVar7;
    lVar9 = b->entries;
    if (lVar9 < 1) {
      uVar22 = 0;
      sparsemap[-2] = 0x1da088;
      sparsemap[-1] = 0;
      pcVar8 = (char *)malloc(0);
      pcVar3->dec_codelengths = pcVar8;
      pcVar3->dec_maxlength = 0;
    }
    else {
      pcVar8 = b->lengthlist;
      lVar13 = 0;
      iVar15 = 0;
      do {
        if ('\0' < pcVar8[lVar13]) {
          lVar16 = (long)iVar15;
          iVar15 = iVar15 + 1;
          piVar7[sparsemap[lVar16]] = (int)lVar13;
        }
        lVar13 = lVar13 + 1;
      } while (lVar9 != lVar13);
      sparsemap[-2] = 0x1d9fbe;
      sparsemap[-1] = 0;
      pcVar8 = (char *)malloc((long)iVar15);
      pcVar3->dec_codelengths = pcVar8;
      pcVar3->dec_maxlength = 0;
      if (lVar9 < 1) {
        uVar22 = 0;
      }
      else {
        pcVar8 = local_40->lengthlist;
        iVar15 = 0;
        lVar9 = 0;
        uVar22 = 0;
        do {
          if ('\0' < pcVar8[lVar9]) {
            lVar13 = (long)(int)uVar22;
            uVar22 = uVar22 + 1;
            pcVar3->dec_codelengths[sparsemap[lVar13]] = pcVar8[lVar9];
            pcVar8 = local_40->lengthlist;
            iVar11 = (int)pcVar8[lVar9];
            iVar15 = pcVar3->dec_maxlength;
            if (iVar15 < iVar11) {
              pcVar3->dec_maxlength = iVar11;
              iVar15 = iVar11;
            }
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < local_40->entries);
        if ((uVar22 == 1) && (iVar15 == 1)) {
          pcVar3->dec_firsttablen = 1;
          sparsemap[-2] = 0x1da041;
          sparsemap[-1] = 0;
          poVar4 = (ogg_uint32_t *)calloc(2,4);
          pcVar3->dec_firsttable = poVar4;
          poVar4[0] = 1;
          poVar4[1] = 1;
          return 0;
        }
      }
    }
    uVar20 = (uint)pcVar3->used_entries;
    uVar12 = 0x1f;
    if (uVar20 != 0) {
      for (; uVar20 >> uVar12 == 0; uVar12 = uVar12 - 1) {
      }
    }
    uVar12 = (uVar12 ^ 0xffffffe0) + 0x21;
    if (uVar20 == 0) {
      uVar12 = 0;
    }
    uVar20 = 0xc;
    if (uVar12 < 0xc) {
      uVar20 = uVar12;
    }
    iVar15 = 5;
    if (8 < uVar12) {
      iVar15 = uVar20 - 4;
    }
    pcVar3->dec_firsttablen = iVar15;
    bVar10 = (byte)iVar15;
    uVar17 = (ulong)(uint)(1 << (bVar10 & 0x1f));
    local_40 = (static_codebook *)uVar17;
    sparsemap[-2] = 0x1da0e5;
    sparsemap[-1] = 0;
    poVar4 = (ogg_uint32_t *)calloc(uVar17,4);
    pcVar3->dec_firsttable = poVar4;
    if (0 < (int)uVar22) {
      pcVar8 = pcVar3->dec_codelengths;
      uVar17 = 0;
      do {
        iVar11 = (int)pcVar8[uVar17];
        if ((iVar11 <= iVar15) && (iVar15 - iVar11 != 0x1f)) {
          uVar20 = local_38->codelist[uVar17];
          uVar20 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                   uVar20 << 0x18;
          uVar20 = (uVar20 & 0xf0f0f0f) << 4 | uVar20 >> 4 & 0xf0f0f0f;
          uVar20 = (uVar20 >> 2 & 0x33333333) + (uVar20 & 0x33333333) * 4;
          iVar21 = 0;
          do {
            poVar4[iVar21 << ((byte)iVar11 & 0x1f) |
                   (uVar20 >> 1 & 0x55555555) + (uVar20 & 0x55555555) * 2] = (int)uVar17 + 1;
            iVar21 = iVar21 + 1;
            cVar1 = pcVar8[uVar17];
            iVar11 = (int)cVar1;
          } while (iVar21 < 1 << (bVar10 - cVar1 & 0x1f));
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar22);
    }
    lVar13 = (long)(int)uVar22;
    iVar15 = 0;
    uVar17 = 0;
    lVar9 = 0;
    do {
      uVar20 = iVar15 << (0x20 - bVar10 & 0x1f);
      uVar22 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 | uVar20 << 0x18;
      uVar22 = (uVar22 & 0xf0f0f0f) << 4 | uVar22 >> 4 & 0xf0f0f0f;
      uVar22 = (uVar22 >> 2 & 0x33333333) + (uVar22 & 0x33333333) * 4;
      uVar22 = (uVar22 >> 1 & 0x55555555) + (uVar22 & 0x55555555) * 2;
      lVar16 = lVar9;
      if (poVar4[uVar22] == 0) {
        lVar18 = uVar17 + 1;
        if ((long)(uVar17 + 1) <= lVar13) {
          lVar18 = lVar13;
        }
        uVar14 = uVar17 - 1;
        do {
          uVar17 = lVar18 - 1;
          if ((1 - lVar18) + uVar14 == -1) break;
          uVar17 = uVar14 + 1;
          lVar2 = uVar14 + 2;
          uVar14 = uVar17;
        } while (local_38->codelist[lVar2] <= uVar20);
        if (lVar9 < lVar13) {
          do {
            lVar16 = lVar9;
            if (uVar20 < (local_38->codelist[lVar9] & (uint)(0xfffffffeL << (0x1f - bVar10 & 0x3f)))
               ) break;
            lVar9 = lVar9 + 1;
            lVar16 = lVar13;
          } while (lVar13 != lVar9);
        }
        uVar19 = lVar13 - lVar16;
        uVar14 = 0x7fff;
        if (uVar17 < 0x7fff) {
          uVar14 = uVar17;
        }
        if (0x7ffe < uVar19) {
          uVar19 = 0x7fff;
        }
        poVar4[uVar22] = (uint)uVar19 | (int)uVar14 << 0xf | 0x80000000;
      }
      iVar15 = iVar15 + 1;
      lVar9 = lVar16;
    } while (iVar15 != (int)local_40);
  }
  return 0;
}

Assistant:

int vorbis_book_init_decode(codebook *c,const static_codebook *s){
  int i,j,n=0,tabn;
  int *sortindex;

  memset(c,0,sizeof(*c));

  /* count actually used entries and find max length */
  for(i=0;i<s->entries;i++)
    if(s->lengthlist[i]>0)
      n++;

  c->entries=s->entries;
  c->used_entries=n;
  c->dim=s->dim;

  if(n>0){
    /* two different remappings go on here.

    First, we collapse the likely sparse codebook down only to
    actually represented values/words.  This collapsing needs to be
    indexed as map-valueless books are used to encode original entry
    positions as integers.

    Second, we reorder all vectors, including the entry index above,
    by sorted bitreversed codeword to allow treeless decode. */

    /* perform sort */
    ogg_uint32_t *codes=_make_words(s->lengthlist,s->entries,c->used_entries);
    ogg_uint32_t **codep=alloca(sizeof(*codep)*n);

    if(codes==NULL)goto err_out;

    for(i=0;i<n;i++){
      codes[i]=bitreverse(codes[i]);
      codep[i]=codes+i;
    }

    qsort(codep,n,sizeof(*codep),sort32a);

    sortindex=alloca(n*sizeof(*sortindex));
    c->codelist=_ogg_malloc(n*sizeof(*c->codelist));
    /* the index is a reverse index */
    for(i=0;i<n;i++){
      int position=codep[i]-codes;
      sortindex[position]=i;
    }

    for(i=0;i<n;i++)
      c->codelist[sortindex[i]]=codes[i];
    _ogg_free(codes);

    c->valuelist=_book_unquantize(s,n,sortindex);
    c->dec_index=_ogg_malloc(n*sizeof(*c->dec_index));

    for(n=0,i=0;i<s->entries;i++)
      if(s->lengthlist[i]>0)
        c->dec_index[sortindex[n++]]=i;

    c->dec_codelengths=_ogg_malloc(n*sizeof(*c->dec_codelengths));
    c->dec_maxlength=0;
    for(n=0,i=0;i<s->entries;i++)
      if(s->lengthlist[i]>0){
        c->dec_codelengths[sortindex[n++]]=s->lengthlist[i];
        if(s->lengthlist[i]>c->dec_maxlength)
          c->dec_maxlength=s->lengthlist[i];
      }

    if(n==1 && c->dec_maxlength==1){
      /* special case the 'single entry codebook' with a single bit
       fastpath table (that always returns entry 0 )in order to use
       unmodified decode paths. */
      c->dec_firsttablen=1;
      c->dec_firsttable=_ogg_calloc(2,sizeof(*c->dec_firsttable));
      c->dec_firsttable[0]=c->dec_firsttable[1]=1;

    }else{
      c->dec_firsttablen=ov_ilog(c->used_entries)-4; /* this is magic */
      if(c->dec_firsttablen<5)c->dec_firsttablen=5;
      if(c->dec_firsttablen>8)c->dec_firsttablen=8;

      tabn=1<<c->dec_firsttablen;
      c->dec_firsttable=_ogg_calloc(tabn,sizeof(*c->dec_firsttable));

      for(i=0;i<n;i++){
        if(c->dec_codelengths[i]<=c->dec_firsttablen){
          ogg_uint32_t orig=bitreverse(c->codelist[i]);
          for(j=0;j<(1<<(c->dec_firsttablen-c->dec_codelengths[i]));j++)
            c->dec_firsttable[orig|(j<<c->dec_codelengths[i])]=i+1;
        }
      }

      /* now fill in 'unused' entries in the firsttable with hi/lo search
         hints for the non-direct-hits */
      {
        ogg_uint32_t mask=0xfffffffeUL<<(31-c->dec_firsttablen);
        long lo=0,hi=0;

        for(i=0;i<tabn;i++){
          ogg_uint32_t word=i<<(32-c->dec_firsttablen);
          if(c->dec_firsttable[bitreverse(word)]==0){
            while((lo+1)<n && c->codelist[lo+1]<=word)lo++;
            while(    hi<n && word>=(c->codelist[hi]&mask))hi++;

            /* we only actually have 15 bits per hint to play with here.
               In order to overflow gracefully (nothing breaks, efficiency
               just drops), encode as the difference from the extremes. */
            {
              unsigned long loval=lo;
              unsigned long hival=n-hi;

              if(loval>0x7fff)loval=0x7fff;
              if(hival>0x7fff)hival=0x7fff;
              c->dec_firsttable[bitreverse(word)]=
                0x80000000UL | (loval<<15) | hival;
            }
          }
        }
      }
    }
  }

  return(0);
 err_out:
  vorbis_book_clear(c);
  return(-1);
}